

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

bool CorUnix::InternalTryEnterCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  PalCsInitState PVar1;
  uint uVar2;
  HANDLE pVVar3;
  int *Destination;
  bool local_31;
  bool fRet;
  SIZE_T threadId;
  LONG lNewVal;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  PCRITICAL_SECTION pCriticalSection_local;
  CPalThread *pThread_local;
  
  local_31 = true;
  PVar1 = ::Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if (PVar1 == PalCsNotInitialized) {
    fprintf(_stderr,"] %s %s:%d","InternalTryEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x3ec);
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar3 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,"InternalTryEnterCriticalSection");
  Destination = Volatile<int>::operator&((Volatile<int> *)&pCriticalSection->LockCount);
  uVar2 = InterlockedCompareExchange(Destination,1,0);
  if (uVar2 == 0) {
    pCriticalSection->OwningThread = pVVar3;
    pCriticalSection->RecursionCount = 1;
    if (pCriticalSection->DebugInfo != (PVOID)0x0) {
      Volatile<unsigned_int>::operator+=
                ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x18),1);
      Volatile<unsigned_int>::operator+=
                ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x1c),1);
    }
  }
  else if (((uVar2 & 1) == 0) || (pCriticalSection->OwningThread != pVVar3)) {
    local_31 = false;
  }
  else {
    pCriticalSection->RecursionCount = pCriticalSection->RecursionCount + 1;
    if (pCriticalSection->DebugInfo != (PVOID)0x0) {
      Volatile<unsigned_int>::operator+=
                ((Volatile<unsigned_int> *)((long)pCriticalSection->DebugInfo + 0x1c),1);
    }
  }
  return local_31;
}

Assistant:

bool InternalTryEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

        LONG lNewVal;
        SIZE_T threadId;
        bool fRet = true;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);

        lNewVal = InterlockedCompareExchange (&pPalCriticalSection->LockCount,
                                             (LONG)PALCS_LOCK_BIT,
                                             (LONG)PALCS_LOCK_INIT);
        if (lNewVal == PALCS_LOCK_INIT)
        {
            // CS successfully acquired: setting ownership data
            pPalCriticalSection->OwningThread = threadId;
            pPalCriticalSection->RecursionCount = 1;
#ifdef _DEBUG
            if (NULL != pPalCriticalSection->DebugInfo)
            {
                pPalCriticalSection->DebugInfo->lAcquireCount += 1;
                pPalCriticalSection->DebugInfo->lEnterCount += 1;
            }
#endif // _DEBUG

            goto ITECS_exit;
        }

        // check if the current thread already owns the criticalSection
        if ((lNewVal & PALCS_LOCK_BIT) &&
            (pPalCriticalSection->OwningThread == threadId))
        {
            pPalCriticalSection->RecursionCount += 1;
#ifdef _DEBUG
            if (NULL != pPalCriticalSection->DebugInfo)
            {
                pPalCriticalSection->DebugInfo->lEnterCount += 1;
            }
#endif // _DEBUG

            goto ITECS_exit;
        }

        // Failed to acquire the CS
        fRet = false;

    ITECS_exit:
        return fRet;
    }